

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall
DIntermissionScreenText::Init(DIntermissionScreenText *this,FIntermissionAction *desc,bool first)

{
  char *pcVar1;
  size_t sVar2;
  bool first_local;
  FIntermissionAction *desc_local;
  DIntermissionScreenText *this_local;
  
  DIntermissionScreen::Init(&this->super_DIntermissionScreen,desc,first);
  pcVar1 = FString::operator_cast_to_char_((FString *)(desc + 1));
  this->mText = pcVar1;
  if (*this->mText == '$') {
    pcVar1 = FStringTable::operator()(&GStrings,this->mText + 1);
    this->mText = pcVar1;
  }
  this->mTextSpeed = *(int *)&desc[1].field_0xc;
  this->mTextX = *(int *)&desc[1].mClass;
  if (this->mTextX < 0) {
    this->mTextX = gameinfo.TextScreenX;
  }
  this->mTextY = *(int *)((long)&desc[1].mClass + 4);
  if (this->mTextY < 0) {
    this->mTextY = gameinfo.TextScreenY;
  }
  sVar2 = strlen(this->mText);
  this->mTextLen = (int)sVar2;
  this->mTextDelay = desc[1].mSize;
  this->mTextColor = *(EColorRange *)&desc[1].mMusic.Chars;
  if (0 < *(int *)&(this->super_DIntermissionScreen).super_DObject.field_0x24) {
    *(int *)&(this->super_DIntermissionScreen).super_DObject.field_0x24 =
         this->mTextDelay + this->mTextSpeed * this->mTextLen +
         *(int *)&(this->super_DIntermissionScreen).super_DObject.field_0x24;
  }
  return;
}

Assistant:

void DIntermissionScreenText::Init(FIntermissionAction *desc, bool first)
{
	Super::Init(desc, first);
	mText = static_cast<FIntermissionActionTextscreen*>(desc)->mText;
	if (mText[0] == '$') mText = GStrings(&mText[1]);
	mTextSpeed = static_cast<FIntermissionActionTextscreen*>(desc)->mTextSpeed;
	mTextX = static_cast<FIntermissionActionTextscreen*>(desc)->mTextX;
	if (mTextX < 0) mTextX =gameinfo.TextScreenX;
	mTextY = static_cast<FIntermissionActionTextscreen*>(desc)->mTextY;
	if (mTextY < 0) mTextY =gameinfo.TextScreenY;
	mTextLen = (int)strlen(mText);
	mTextDelay = static_cast<FIntermissionActionTextscreen*>(desc)->mTextDelay;
	mTextColor = static_cast<FIntermissionActionTextscreen*>(desc)->mTextColor;
	// For text screens, the duration only counts when the text is complete.
	if (mDuration > 0) mDuration += mTextDelay + mTextSpeed * mTextLen;
}